

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::getCommandBufferMutableConfigString
          (CLIntercept *this,cl_uint num_configs,cl_command_buffer_update_type_khr *config_types,
          void **configs,string *str)

{
  ulong *puVar1;
  undefined8 *puVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  char *__format;
  cl_uint work_dim;
  _Base_ptr p_Var5;
  CLIntercept *this_00;
  long lVar6;
  long lVar7;
  cl_uint a;
  ulong uVar8;
  string dispatchStr;
  char s [256];
  undefined4 uVar10;
  undefined8 uVar9;
  string local_190;
  _Base_ptr local_170;
  CEnumNameMap *local_168;
  CLIntercept *local_160;
  ulong local_158;
  cl_command_buffer_update_type_khr *local_150;
  void **local_148;
  ulong local_140;
  char local_138 [264];
  
  std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x19d01f);
  if (configs != (void **)0x0 &&
      (config_types != (cl_command_buffer_update_type_khr *)0x0 && num_configs != 0)) {
    local_168 = &this->m_EnumNameMap;
    local_170 = &(this->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar8 = (ulong)num_configs;
    uVar4 = 0;
    local_160 = this;
    local_158 = uVar8;
    local_150 = config_types;
    local_148 = configs;
    do {
      puVar1 = (ulong *)local_148[uVar4];
      local_140 = uVar4;
      if (puVar1 == (ulong *)0x0) {
        snprintf(local_138,0x100,"\n  config %u: NULL!");
LAB_0016c504:
        std::__cxx11::string::append((char *)str);
      }
      else {
        if (config_types[uVar4] != 0) {
          snprintf(local_138,0x100,"\n  config %u: unknown type %u!");
          goto LAB_0016c504;
        }
        CEnumNameMap::name_command_buffer_update_type_abi_cxx11_(&local_190,local_168,0);
        uVar8 = *puVar1;
        snprintf(local_138,0x100,"\n  config %u: type = %s (%u), command = %p:",uVar4 & 0xffffffff,
                 local_190._M_dataplus._M_p,(ulong)config_types[uVar4],uVar8);
        uVar10 = (undefined4)(uVar8 >> 0x20);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)str);
        uVar9 = CONCAT44(uVar10,*(undefined4 *)((long)puVar1 + 0x14));
        snprintf(local_138,0x100,
                 "\n    num_args = %u, num_svm_args = %u, num_exec_infos = %u, work_dim = %u",
                 (ulong)(uint)puVar1[1],(ulong)*(uint *)((long)puVar1 + 0xc),(ulong)(uint)puVar1[2],
                 uVar9);
        this_00 = (CLIntercept *)str;
        std::__cxx11::string::append((char *)str);
        if ((int)puVar1[1] != 0) {
          if (puVar1[3] == 0) {
            snprintf(local_138,0x100,"\n      error: num_args is %u and arg_list is NULL!");
            this_00 = (CLIntercept *)str;
            std::__cxx11::string::append((char *)str);
          }
          else {
            lVar7 = 0;
            uVar8 = 0;
            do {
              uVar4 = puVar1[3];
              lVar6 = *(long *)(uVar4 + 8 + lVar7);
              puVar2 = *(undefined8 **)(uVar4 + 0x10 + lVar7);
              if (puVar2 == (undefined8 *)0x0) {
LAB_0016c614:
                uVar4 = (ulong)*(uint *)(uVar4 + lVar7);
                __format = "\n      arg %u: arg_index = %u, arg_size = %zu";
              }
              else if (lVar6 == 4) {
                uVar4 = (ulong)*(uint *)(uVar4 + lVar7);
                uVar9 = CONCAT44((int)((ulong)uVar9 >> 0x20),*(undefined4 *)puVar2);
                lVar6 = 4;
                __format = "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%x";
              }
              else {
                if (lVar6 != 8) goto LAB_0016c614;
                uVar4 = (ulong)*(uint *)(uVar4 + lVar7);
                uVar9 = *puVar2;
                lVar6 = 8;
                __format = "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = %p";
              }
              snprintf(local_138,0x100,__format,uVar8 & 0xffffffff,uVar4,lVar6,uVar9);
              this_00 = (CLIntercept *)str;
              std::__cxx11::string::append((char *)str);
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + 0x18;
            } while (uVar8 < (uint)puVar1[1]);
          }
        }
        if (*(int *)((long)puVar1 + 0xc) != 0) {
          if (puVar1[4] == 0) {
            snprintf(local_138,0x100,"\n      error: num_svm_args is %u and arg_svm_list is NULL!");
            this_00 = (CLIntercept *)str;
            std::__cxx11::string::append((char *)str);
          }
          else {
            lVar7 = 0x10;
            uVar8 = 0;
            do {
              snprintf(local_138,0x100,"\n      svm arg %u: arg_index = %u, arg_value = %p",
                       uVar8 & 0xffffffff,(ulong)*(uint *)((puVar1[4] - 0x10) + lVar7),
                       *(undefined8 *)(puVar1[4] + lVar7));
              this_00 = (CLIntercept *)str;
              std::__cxx11::string::append((char *)str);
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + 0x18;
            } while (uVar8 < *(uint *)((long)puVar1 + 0xc));
          }
        }
        if ((int)puVar1[2] != 0) {
          if (puVar1[5] == 0) {
            snprintf(local_138,0x100,
                     "\n      error: num_exec_infos is %u and exec_info_list is NULL!");
            this_00 = (CLIntercept *)str;
            std::__cxx11::string::append((char *)str);
          }
          else {
            lVar7 = 0;
            uVar8 = 0;
            do {
              uVar4 = puVar1[5];
              CEnumNameMap::name_abi_cxx11_(&local_190,local_168,*(cl_int *)(uVar4 + lVar7));
              puVar2 = (undefined8 *)(uVar4 + 8 + lVar7);
              snprintf(local_138,0x100,
                       "\n      exec info %u: param_name = %s (%04X), param_value_size = %zu, param_value = %p"
                       ,uVar8 & 0xffffffff,local_190._M_dataplus._M_p,
                       (ulong)*(uint *)(uVar4 + lVar7),*puVar2,*(undefined4 *)(puVar2 + 1));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p);
              }
              this_00 = (CLIntercept *)str;
              std::__cxx11::string::append((char *)str);
              uVar8 = uVar8 + 1;
              lVar7 = lVar7 + 0x18;
            } while (uVar8 < (uint)puVar1[2]);
          }
        }
        config_types = local_150;
        uVar8 = local_158;
        if ((((size_t *)puVar1[6] != (size_t *)0x0) || (puVar1[7] != 0)) || (puVar1[8] != 0)) {
          work_dim = *(cl_uint *)((long)puVar1 + 0x14);
          if (work_dim == 0) {
            p_Var5 = (local_160->m_MutableCommandInfoMap)._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_parent;
            if (p_Var5 != (_Base_ptr)0x0) {
              uVar4 = *puVar1;
              p_Var3 = local_170;
              do {
                this_00 = (CLIntercept *)(ulong)(*(ulong *)(p_Var5 + 1) < uVar4);
                if (*(ulong *)(p_Var5 + 1) >= uVar4) {
                  p_Var3 = p_Var5;
                }
                p_Var5 = (&p_Var5->_M_left)[(long)this_00];
              } while (p_Var5 != (_Base_ptr)0x0);
              if (((p_Var3 != local_170) && (*(ulong *)(p_Var3 + 1) <= uVar4)) &&
                 (work_dim = *(cl_uint *)&p_Var3[1]._M_left, work_dim != 0)) goto LAB_0016c80a;
            }
          }
          else {
LAB_0016c80a:
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            local_190._M_string_length = 0;
            local_190.field_2._M_local_buf[0] = '\0';
            getEnqueueNDRangeKernelArgsString
                      (this_00,work_dim,(size_t *)puVar1[6],(size_t *)puVar1[7],(size_t *)puVar1[8],
                       &local_190);
            std::__cxx11::string::append((char *)str);
            std::__cxx11::string::_M_append((char *)str,(ulong)local_190._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p);
            }
          }
        }
      }
      uVar4 = local_140 + 1;
    } while (uVar4 != uVar8);
  }
  return;
}

Assistant:

void CLIntercept::getCommandBufferMutableConfigString(
    cl_uint num_configs,
    const cl_command_buffer_update_type_khr* config_types,
    const void** configs,
    std::string& str ) const
{
    str = "";

    if( num_configs > 0 && config_types != nullptr && configs != nullptr )
    {
        char s[256];

        for( cl_uint i = 0; i < num_configs; i++ )
        {
            if( configs[i] == nullptr )
            {
                CLI_SPRINTF(s, 256, "\n  config %u: NULL!", i );
                str += s;
            }
            else if( config_types[i] == CL_STRUCTURE_TYPE_MUTABLE_DISPATCH_CONFIG_KHR )
            {
                auto dispatchConfig = (const cl_mutable_dispatch_config_khr*)configs[i];
                CLI_SPRINTF(s, 256, "\n  config %u: type = %s (%u), command = %p:",
                    i,
                    enumName().name_command_buffer_update_type(config_types[i]).c_str(),
                    config_types[i],
                    dispatchConfig->command);
                str += s;

                CLI_SPRINTF(s, 256, "\n    num_args = %u, num_svm_args = %u, num_exec_infos = %u, work_dim = %u",
                    dispatchConfig->num_args,
                    dispatchConfig->num_svm_args,
                    dispatchConfig->num_exec_infos,
                    dispatchConfig->work_dim);
                str += s;

                if( dispatchConfig->num_args != 0 &&
                    dispatchConfig->arg_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_args is %u and arg_list is NULL!",
                            dispatchConfig->num_args);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_args; a++ )
                    {
                        const cl_mutable_dispatch_arg_khr* arg =
                            &dispatchConfig->arg_list[a];
                        if( ( arg->arg_value != NULL ) &&
                            ( arg->arg_size == sizeof(cl_mem) ) )
                        {
                            cl_mem* pMem = (cl_mem*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = %p",
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pMem[0] );
                        }
                        else if( ( arg->arg_value != NULL ) &&
                                 ( arg->arg_size == sizeof(cl_uint) ) )
                        {
                            cl_uint*    pData = (cl_uint*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%x",
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pData[0]);
                        }
                        else if( ( arg->arg_value != NULL ) &&
                                 ( arg->arg_size == sizeof(cl_ulong) ) )
                        {
                            cl_ulong*   pData = (cl_ulong*)arg->arg_value;
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu, arg_value = 0x%" PRIx64,
                                a,
                                arg->arg_index,
                                arg->arg_size,
                                pData[0]);
                        }
                        else
                        {
                            CLI_SPRINTF(s, 256, "\n      arg %u: arg_index = %u, arg_size = %zu",
                                a,
                                arg->arg_index,
                                arg->arg_size);
                        }

                        str += s;
                    }
                }

                if( dispatchConfig->num_svm_args != 0 &&
                    dispatchConfig->arg_svm_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_svm_args is %u and arg_svm_list is NULL!",
                            dispatchConfig->num_svm_args);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_svm_args; a++ )
                    {
                        const cl_mutable_dispatch_arg_khr* arg =
                            &dispatchConfig->arg_svm_list[a];
                        CLI_SPRINTF(s, 256, "\n      svm arg %u: arg_index = %u, arg_value = %p",
                            a,
                            arg->arg_index,
                            arg->arg_value);
                        str += s;
                    }
                }

                if( dispatchConfig->num_exec_infos != 0 &&
                    dispatchConfig->exec_info_list == nullptr )
                {
                        CLI_SPRINTF(s, 256, "\n      error: num_exec_infos is %u and exec_info_list is NULL!",
                            dispatchConfig->num_exec_infos);
                        str += s;
                }
                else
                {
                    for( cl_uint a = 0; a < dispatchConfig->num_exec_infos; a++ )
                    {
                        const cl_mutable_dispatch_exec_info_khr* info =
                            &dispatchConfig->exec_info_list[a];
                        CLI_SPRINTF(s, 256, "\n      exec info %u: param_name = %s (%04X), param_value_size = %zu, param_value = %p",
                            a,
                            enumName().name(info->param_name).c_str(),
                            info->param_name,
                            info->param_value_size,
                            info->param_value);
                        str += s;
                    }
                }

                if( dispatchConfig->global_work_offset != nullptr ||
                    dispatchConfig->global_work_size != nullptr ||
                    dispatchConfig->local_work_size != nullptr )
                {
                    cl_uint work_dim = dispatchConfig->work_dim;
                    if( work_dim == 0 )
                    {
                        // TODO: lock?
                        auto iter = m_MutableCommandInfoMap.find(
                            dispatchConfig->command);
                        if( iter != m_MutableCommandInfoMap.end() )
                        {
                            work_dim = iter->second.WorkDim;
                        }
                    }
                    if( work_dim != 0 )
                    {
                        std::string dispatchStr;
                        getEnqueueNDRangeKernelArgsString(
                            work_dim,
                            dispatchConfig->global_work_offset,
                            dispatchConfig->global_work_size,
                            dispatchConfig->local_work_size,
                            dispatchStr);
                        str += "\n      ";
                        str += dispatchStr;
                    }
                }
            }
            else
            {
                CLI_SPRINTF(s, 256, "\n  config %u: unknown type %u!",
                    i,
                    config_types[i] );
                str += s;
            }
        }
    }
}